

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O3

mraa_led_context mraa_led_init_internal(char *led)

{
  mraa_led_context __ptr;
  DIR *__dirp;
  dirent *pdVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  char *__haystack;
  char brightness_path [64];
  char acStack_78 [72];
  
  __ptr = (mraa_led_context)calloc(1,0x20);
  if (__ptr == (mraa_led_context)0x0) {
    syslog(2,"led: init: Failed to allocate memory for context");
  }
  else {
    __ptr->trig_fd = -1;
    __ptr->bright_fd = -1;
    __ptr->max_bright_fd = -1;
    __dirp = opendir("/sys/class/leds");
    if (__dirp == (DIR *)0x0) {
      syslog(2,"led: init: unknown device specified");
    }
    else {
      pdVar1 = readdir(__dirp);
      if (pdVar1 != (dirent *)0x0) {
        iVar4 = 0;
        do {
          __haystack = pdVar1->d_name;
          pcVar2 = strstr(__haystack,led);
          if (pcVar2 != (char *)0x0) {
            __ptr->count = iVar4;
            sVar3 = strlen(__haystack);
            pcVar2 = (char *)calloc(sVar3 + 0x12,1);
            if (pcVar2 == (char *)0x0) {
              __ptr = (mraa_led_context)0x0;
              syslog(2,"led: init: Failed to allocate memory for LED path");
            }
            else {
              snprintf(pcVar2,sVar3 + 0x12,"%s/%s","/sys/class/leds",__haystack);
              __ptr->led_path = pcVar2;
              snprintf(acStack_78,0x40,"%s/%s",pcVar2,"brightness");
              iVar4 = access(acStack_78,6);
              if (iVar4 != 0) {
                syslog(5,"led: init: current user doesn\'t have access rights for using LED %s",
                       __haystack);
              }
            }
            closedir(__dirp);
            return __ptr;
          }
          iVar4 = iVar4 + 1;
          pdVar1 = readdir(__dirp);
        } while (pdVar1 != (dirent *)0x0);
      }
      syslog(2,"led: init: unknown device specified");
      closedir(__dirp);
    }
    free(__ptr);
  }
  return (mraa_led_context)0x0;
}

Assistant:

static mraa_led_context
mraa_led_init_internal(const char* led)
{
    char brightness_path[MAX_SIZE];
    const char *led_name = NULL;
    char *led_path;
    size_t led_path_len;
    DIR* dir;
    struct dirent* entry;
    int cnt = 0;

    mraa_led_context dev = (mraa_led_context) calloc(1, sizeof(struct _led));
    if (dev == NULL) {
        syslog(LOG_CRIT, "led: init: Failed to allocate memory for context");
        return NULL;
    }

    dev->trig_fd = -1;
    dev->bright_fd = -1;
    dev->max_bright_fd = -1;

    if ((dir = opendir(SYSFS_CLASS_LED)) != NULL) {
        /* get the led name from sysfs path */
        while ((entry = readdir(dir)) != NULL) {
            if (strstr((const char*) entry->d_name, led)) {
                led_name = entry->d_name;
                break;
            }
            cnt++;
        }
    }
    dev->count = cnt;
    if (led_name == NULL) {
        syslog(LOG_CRIT, "led: init: unknown device specified");
        if (dir != NULL) {
            closedir(dir);
        }
        free(dev);
        return NULL;
    }

    led_path_len = strlen(SYSFS_CLASS_LED) + strlen(led_name) + 3;
    led_path = calloc(led_path_len, sizeof(char));
    if (led_path == NULL) {
        syslog(LOG_CRIT, "led: init: Failed to allocate memory for LED path");
        closedir(dir);
        return NULL;
    }
    snprintf(led_path, led_path_len, "%s/%s", SYSFS_CLASS_LED, led_name);
    dev->led_path = led_path;

    snprintf(brightness_path, sizeof(brightness_path), "%s/%s", led_path, "brightness");
    if (access(brightness_path, R_OK | W_OK) != 0) {
        syslog(LOG_NOTICE, "led: init: current user doesn't have access rights for using LED %s", led_name);
    }

    closedir(dir);
    return dev;
}